

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O2

void mocker::ir::verifyFuncModule(FunctionModule *func)

{
  BasicBlockList *pBVar1;
  long lVar2;
  pointer puVar3;
  bool bVar4;
  _List_node_base *p_Var5;
  iterator iVar6;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_> *option;
  long lVar9;
  shared_ptr<mocker::ir::Reg> dest;
  shared_ptr<mocker::ir::Reg> reg;
  shared_ptr<mocker::ir::Phi> phi;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defined;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_c8;
  _List_node_base *local_b0;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  long local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  FunctionModule *local_78;
  unsigned_long local_70;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  pBVar1 = &func->bbs;
  p_Var5 = (_List_node_base *)pBVar1;
  local_78 = func;
  while (p_Var5 = (((_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> *)
                   &p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var5 != (_List_node_base *)pBVar1) {
    bVar4 = BasicBlock::isCompleted((BasicBlock *)(p_Var5 + 1));
    if (!bVar4) {
      __assert_fail("false && \"block not being terminated\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                    ,0xfa,"void mocker::ir::verifyFuncModule(const ir::FunctionModule &)");
    }
  }
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  p_Var5 = (_List_node_base *)pBVar1;
  while (p_Var8 = (((_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> *)
                   &p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var8 != (_List_node_base *)pBVar1) {
    p_Var7 = (_List_node_base *)&p_Var8[1]._M_prev;
    local_b0 = p_Var8;
    while (p_Var7 = p_Var7->_M_next, p_Var5 = local_b0,
          p_Var7 != (_List_node_base *)&p_Var8[1]._M_prev) {
      getDest((shared_ptr<mocker::ir::IRInst> *)&local_c8);
      if ((element_type *)local_c8._M_impl.super__Vector_impl_data._M_start != (element_type *)0x0)
      {
        std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<mocker::ir::Reg,void>
                  ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&local_88,
                   (__shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2> *)&local_c8);
        dycLocalReg((shared_ptr<mocker::ir::Addr> *)&local_a8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80);
        if (local_a8._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
          __assert_fail("reg",
                        "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                        ,0x104,"void mocker::ir::verifyFuncModule(const ir::FunctionModule &)");
        }
        iVar6 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(&local_68,(key_type *)(local_a8._M_impl.super__Vector_impl_data._M_start + 1)
                      );
        if (iVar6.
            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ._M_cur != (__node_type *)0x0) {
          __assert_fail("false && \"register with multiple definitions\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                        ,0x106,"void mocker::ir::verifyFuncModule(const ir::FunctionModule &)");
        }
        std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::_M_emplace<std::__cxx11::string_const&>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&local_68,local_a8._M_impl.super__Vector_impl_data._M_start + 1);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_a8._M_impl.super__Vector_impl_data._M_finish);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_c8._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  p_Var5 = (_List_node_base *)pBVar1;
  while (p_Var5 = (((_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> *)
                   &p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var5 != (_List_node_base *)pBVar1) {
    p_Var8 = (_List_node_base *)&p_Var5[1]._M_prev;
    do {
      p_Var8 = p_Var8->_M_next;
      dyc<mocker::ir::Phi,std::shared_ptr<mocker::ir::IRInst>const&>
                ((ir *)&local_c8,(shared_ptr<mocker::ir::IRInst> *)(p_Var8 + 1));
      puVar3 = local_c8._M_impl.super__Vector_impl_data._M_start;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_c8._M_impl.super__Vector_impl_data._M_finish);
    } while ((element_type *)puVar3 != (element_type *)0x0);
    std::dynamic_pointer_cast<mocker::ir::Terminator,mocker::ir::IRInst>
              ((shared_ptr<mocker::ir::IRInst> *)&local_c8);
    puVar3 = local_c8._M_impl.super__Vector_impl_data._M_start;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_c8._M_impl.super__Vector_impl_data._M_finish);
    if ((element_type *)puVar3 == (element_type *)0x0) {
      dyc<mocker::ir::Phi,std::shared_ptr<mocker::ir::IRInst>const&>
                ((ir *)&local_c8,(shared_ptr<mocker::ir::IRInst> *)(p_Var8 + 1));
      puVar3 = local_c8._M_impl.super__Vector_impl_data._M_start;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_c8._M_impl.super__Vector_impl_data._M_finish);
      if ((element_type *)puVar3 != (element_type *)0x0) {
        __assert_fail("false && \"misplaced phi-function\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                      ,0x112,"void mocker::ir::verifyFuncModule(const ir::FunctionModule &)");
      }
    }
  }
  p_Var5 = (_List_node_base *)pBVar1;
  do {
    p_Var5 = p_Var5->_M_next;
    if (p_Var5 == (_List_node_base *)pBVar1) {
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_68);
      return;
    }
    FunctionModule::getPredcessors
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_c8,local_78,
               (size_t)p_Var5[1]._M_next);
    std::
    __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (local_c8._M_impl.super__Vector_impl_data._M_start,
               local_c8._M_impl.super__Vector_impl_data._M_finish);
    p_Var8 = (_List_node_base *)&p_Var5[1]._M_prev;
    local_b0 = p_Var5;
    while (p_Var8 = p_Var8->_M_next, p_Var8 != (_List_node_base *)&p_Var5[1]._M_prev) {
      dyc<mocker::ir::Phi,std::shared_ptr<mocker::ir::IRInst>const&>
                ((ir *)&local_88,(shared_ptr<mocker::ir::IRInst> *)(p_Var8 + 1));
      if (local_88 == 0) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80);
        break;
      }
      local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      lVar2 = *(long *)(local_88 + 0x30);
      for (lVar9 = *(long *)(local_88 + 0x28); lVar9 != lVar2; lVar9 = lVar9 + 0x20) {
        local_70 = *(unsigned_long *)(*(long *)(lVar9 + 0x10) + 8);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a8,&local_70);
      }
      std::
      __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (local_a8._M_impl.super__Vector_impl_data._M_start,
                 local_a8._M_impl.super__Vector_impl_data._M_finish);
      bVar4 = std::operator!=((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_c8,
                              (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a8);
      if (bVar4) {
        __assert_fail("false && \"mismatched predecessors and phi-function options\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                      ,0x126,"void mocker::ir::verifyFuncModule(const ir::FunctionModule &)");
      }
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_a8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80);
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_c8);
    p_Var5 = local_b0;
  } while( true );
}

Assistant:

void verifyFuncModule(const ir::FunctionModule &func) {
  // check whether all blocks are terminated
  for (const auto &bb : func.getBBs())
    if (!bb.isCompleted())
      assert(false && "block not being terminated");

  // check whether all register are only defined once
  std::unordered_set<std::string> defined;
  for (auto &bb : func.getBBs()) {
    for (auto &inst : bb.getInsts()) {
      auto dest = getDest(inst);
      if (!dest)
        continue;
      auto reg = dycLocalReg(dest);
      assert(reg);
      if (defined.find(reg->getIdentifier()) != defined.end())
        assert(false && "register with multiple definitions");
      defined.emplace(reg->getIdentifier());
    }
  }

  // check whether there exists phi-functions that are in the middle of a block
  for (const auto &bb : func.getBBs()) {
    auto iter = bb.getInsts().begin();
    while (ir::dyc<ir::Phi>(*iter))
      ++iter;
    if (!ir::dyc<ir::Terminator>(*iter)) {
      if (ir::dyc<ir::Phi>(*iter))
        assert(false && "misplaced phi-function");
      ++iter;
    }
  }

  // check the validation of phi-functions
  for (const auto &bb : func.getBBs()) {
    auto preds = func.getPredcessors(bb.getLabelID());
    std::sort(preds.begin(), preds.end());

    for (auto &inst : bb.getInsts()) {
      auto phi = dyc<ir::Phi>(inst);
      if (!phi)
        break;

      std::vector<std::size_t> sources;
      for (auto &option : phi->getOptions())
        sources.emplace_back(option.second->getID());
      std::sort(sources.begin(), sources.end());
      if (preds != sources)
        assert(false && "mismatched predecessors and phi-function options");
    }
  }
}